

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extdev.c
# Opt level: O3

int envy_bios_parse_extdev(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined8 in_RAX;
  long lVar5;
  envy_bios_extdev_entry *peVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  char *__format;
  ulong uVar14;
  uint uVar15;
  uint8_t bytes [4];
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  uVar7 = (bios->extdev).offset;
  iVar11 = 0;
  if (uVar7 != 0) {
    uVar13 = bios->length;
    if (uVar7 < uVar13) {
      (bios->extdev).version = bios->data[(uint)uVar7];
      uVar15 = 0;
    }
    else {
      (bios->extdev).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar7 = (bios->extdev).offset;
      uVar13 = bios->length;
      uVar15 = 0xfffffff2;
    }
    uVar14 = (ulong)uVar7;
    lVar5 = uVar14 + 1;
    if ((uint)lVar5 < uVar13) {
      (bios->extdev).hlen = bios->data[lVar5];
      uVar12 = 0;
    }
    else {
      (bios->extdev).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar5);
      uVar14 = (ulong)(bios->extdev).offset;
      uVar13 = bios->length;
      uVar12 = 0xfffffff2;
    }
    uVar9 = (uint)uVar14;
    lVar5 = uVar14 + 2;
    if ((uint)lVar5 < uVar13) {
      (bios->extdev).entriesnum = bios->data[lVar5];
      uVar4 = 0;
    }
    else {
      (bios->extdev).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar5);
      uVar9 = (uint)(bios->extdev).offset;
      uVar13 = bios->length;
      uVar4 = 0xfffffff2;
    }
    if ((uint)((ulong)uVar9 + 3) < uVar13) {
      (bios->extdev).rlen = bios->data[(ulong)uVar9 + 3];
      uVar13 = 0;
    }
    else {
      (bios->extdev).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar13 = 0xfffffff2;
    }
    uVar13 = uVar12 | uVar15 | uVar4 | uVar13;
    if (4 < (bios->extdev).hlen) {
      lVar5 = (ulong)(bios->extdev).offset + 4;
      if ((uint)lVar5 < bios->length) {
        (bios->extdev).unk04 = bios->data[lVar5];
        uVar15 = 0;
      }
      else {
        (bios->extdev).unk04 = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar15 = 0xfffffff2;
      }
      uVar13 = uVar13 | uVar15;
    }
    if (uVar13 == 0) {
      envy_bios_block(bios,(uint)(bios->extdev).offset,
                      (uint)(bios->extdev).entriesnum * (uint)(bios->extdev).rlen +
                      (uint)(bios->extdev).hlen,"EXTDEV",-1);
      uVar1 = (bios->extdev).version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        bVar2 = (bios->extdev).hlen;
        uVar10 = (ulong)bVar2;
        uVar13 = 5 - (bVar2 < 5);
        uVar14 = (ulong)uVar13;
        if (uVar13 < bVar2 || uVar13 == bVar2) {
          bVar3 = (bios->extdev).rlen;
          if (3 < bVar3) {
            if (uVar13 < bVar2) {
              fprintf(_stderr,"EXTDEV table header longer than expected [%d > %d]\n");
              bVar3 = (bios->extdev).rlen;
            }
            if (4 < bVar3) {
              envy_bios_parse_extdev_cold_1();
            }
            bVar2 = (bios->extdev).entriesnum;
            peVar6 = (envy_bios_extdev_entry *)calloc((ulong)bVar2,8);
            (bios->extdev).entries = peVar6;
            if (peVar6 == (envy_bios_extdev_entry *)0x0) {
              return -0xc;
            }
            if (bVar2 != 0) {
              peVar6 = (bios->extdev).entries;
              uVar7 = (ushort)(bios->extdev).hlen + (bios->extdev).offset;
              uVar13 = bios->length;
              uVar14 = 0;
              uVar8 = (ushort)(bios->extdev).rlen;
              uVar15 = (uint)uVar7;
              do {
                uVar10 = (ulong)(uVar15 & 0xffff);
                peVar6[uVar14].offset = (short)uVar14 * uVar8 + uVar7;
                lVar5 = 0;
                do {
                  if (uVar13 <= (uint)uVar10) {
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    goto LAB_0025adbe;
                  }
                  *(uint8_t *)((long)&local_24 + lVar5) = bios->data[uVar10];
                  lVar5 = lVar5 + 1;
                  uVar10 = uVar10 + 1;
                } while (lVar5 != 4);
                peVar6[uVar14].type = (uint8_t)local_24;
                peVar6[uVar14].addr = local_24._1_1_;
                peVar6[uVar14].bus = local_24._2_1_ >> 4 & 1;
                peVar6[uVar14].unk02_0 = local_24._2_1_ & 0xf;
                peVar6[uVar14].unk02_5 = local_24._2_1_ >> 5;
                peVar6[uVar14].unk03 = local_24._3_1_;
                uVar14 = uVar14 + 1;
                uVar15 = (uVar15 & 0xffff) + (uint)uVar8;
              } while (uVar14 < (bios->extdev).entriesnum);
            }
            (bios->extdev).valid = '\x01';
            return 0;
          }
          __format = "EXTDEV table record too short [%d < %d]\n";
          uVar10 = (ulong)(uint)bVar3;
          uVar14 = 4;
        }
        else {
          __format = "EXTDEV table header too short [%d < %d]\n";
        }
        fprintf(_stderr,__format,uVar10,uVar14);
      }
      else {
        envy_bios_parse_extdev_cold_2();
      }
      iVar11 = -0x16;
    }
    else {
LAB_0025adbe:
      iVar11 = -0xe;
    }
  }
  return iVar11;
}

Assistant:

int envy_bios_parse_extdev (struct envy_bios *bios) {
	struct envy_bios_extdev *extdev = &bios->extdev;
	if (!extdev->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, extdev->offset, &extdev->version);
	err |= bios_u8(bios, extdev->offset+1, &extdev->hlen);
	err |= bios_u8(bios, extdev->offset+2, &extdev->entriesnum);
	err |= bios_u8(bios, extdev->offset+3, &extdev->rlen);
	if (extdev->hlen >= 5)
		err |= bios_u8(bios, extdev->offset+4, &extdev->unk04);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, extdev->offset, extdev->hlen + extdev->rlen * extdev->entriesnum, "EXTDEV", -1);
	int wanthlen = 4;
	int wantrlen = 4;
	switch (extdev->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown EXTDEV table version %d.%d\n", extdev->version >> 4, extdev->version & 0xf);
			return -EINVAL;
	}
	if (extdev->hlen >= 5)
		wanthlen = 5;
	if (extdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("EXTDEV table header too short [%d < %d]\n", extdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (extdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("EXTDEV table record too short [%d < %d]\n", extdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (extdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("EXTDEV table header longer than expected [%d > %d]\n", extdev->hlen, wanthlen);
	}
	if (extdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("EXTDEV table record longer than expected [%d > %d]\n", extdev->rlen, wantrlen);
	}
	extdev->entries = calloc(extdev->entriesnum, sizeof *extdev->entries);
	if (!extdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < extdev->entriesnum; i++) {
		struct envy_bios_extdev_entry *entry = &extdev->entries[i];
		entry->offset = extdev->offset + extdev->hlen + extdev->rlen * i;
		uint8_t bytes[4];
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		entry->type = bytes[0];
		entry->addr = bytes[1];
		entry->bus = bytes[2] >> 4 & 1;
		entry->unk02_0 = bytes[2] & 0xf;
		entry->unk02_5 = bytes[2] >> 5;
		entry->unk03 = bytes[3];
	}
	extdev->valid = 1;
	return 0;
}